

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

bool __thiscall S2Polygon::FindValidationError(S2Polygon *this,S2Error *error)

{
  byte bVar1;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> _Var2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  pointer puVar6;
  int iVar7;
  long lVar8;
  char *format;
  Code CVar9;
  ulong uVar10;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar6 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar7 = (int)((ulong)((long)(this->loops_).
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 3);
  bVar5 = 0 < iVar7;
  if (0 < iVar7) {
    uVar10 = 0;
    do {
      bVar4 = S2Loop::FindValidationErrorNoIndex
                        ((S2Loop *)
                         puVar6[uVar10]._M_t.
                         super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,error);
      if (bVar4) {
        CVar9 = error->code_;
        local_50[0] = local_40;
        pcVar3 = (error->text_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar3,pcVar3 + (error->text_)._M_string_length);
        S2Error::Init(error,CVar9,"Loop %d: %s",uVar10 & 0xffffffff,local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
LAB_0020ae8b:
        if (bVar5) {
          return true;
        }
        break;
      }
      puVar6 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
      super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
           puVar6[uVar10]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
      iVar7 = *(int *)((long)_Var2._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc);
      bVar1 = *(byte *)((long)_Var2._M_t.
                              super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                              super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a);
      if (iVar7 == 1 && (bVar1 & 1) == 0) {
        format = "Loop %d: empty loops are not allowed";
        CVar9 = POLYGON_EMPTY_LOOP;
LAB_0020ae81:
        S2Error::Init(error,CVar9,format,uVar10 & 0xffffffff);
        goto LAB_0020ae8b;
      }
      if (((iVar7 == 1 & bVar1) == 1) &&
         (1 < (int)((ulong)((long)(this->loops_).
                                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 3)))
      {
        format = "Loop %d: full loop appears in non-full polygon";
        CVar9 = POLYGON_EXCESS_FULL_LOOP;
        goto LAB_0020ae81;
      }
      uVar10 = uVar10 + 1;
      puVar6 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)(int)((ulong)((long)(this->loops_).
                                        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6)
                         >> 3);
      bVar5 = (long)uVar10 < lVar8;
    } while ((long)uVar10 < lVar8);
  }
  bVar5 = s2shapeutil::FindSelfIntersection(&(this->index_).super_S2ShapeIndex,error);
  bVar4 = true;
  if (!bVar5) {
    if (this->error_inconsistent_loop_orientations_ == '\0') {
      bVar4 = FindLoopNestingError(this,error);
    }
    else {
      S2Error::Init(error,POLYGON_INCONSISTENT_LOOP_ORIENTATIONS,
                    "Inconsistent loop orientations detected");
    }
  }
  return bVar4;
}

Assistant:

bool S2Polygon::FindValidationError(S2Error* error) const {
  for (int i = 0; i < num_loops(); ++i) {
    // Check for loop errors that don't require building an S2ShapeIndex.
    if (loop(i)->FindValidationErrorNoIndex(error)) {
      error->Init(error->code(),
                  "Loop %d: %s", i, error->text().c_str());
      return true;
    }
    // Check that no loop is empty, and that the full loop only appears in the
    // full polygon.
    if (loop(i)->is_empty()) {
      error->Init(S2Error::POLYGON_EMPTY_LOOP,
                  "Loop %d: empty loops are not allowed", i);
      return true;
    }
    if (loop(i)->is_full() && num_loops() > 1) {
      error->Init(S2Error::POLYGON_EXCESS_FULL_LOOP,
                  "Loop %d: full loop appears in non-full polygon", i);
      return true;
    }
  }

  // Check for loop self-intersections and loop pairs that cross
  // (including duplicate edges and vertices).
  if (s2shapeutil::FindSelfIntersection(index_, error)) return true;

  // Check whether InitOriented detected inconsistent loop orientations.
  if (error_inconsistent_loop_orientations_) {
    error->Init(S2Error::POLYGON_INCONSISTENT_LOOP_ORIENTATIONS,
                "Inconsistent loop orientations detected");
    return true;
  }

  // Finally, verify the loop nesting hierarchy.
  return FindLoopNestingError(error);
}